

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *this_00;
  double *pdVar1;
  float fVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> *this_01;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  Variable<float> *pVVar6;
  pointer pcVar7;
  ostringstream oVar8;
  double **ppdVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  undefined8 uVar13;
  IVal *pIVar14;
  undefined8 *puVar15;
  size_t sVar16;
  long lVar17;
  IVal IVar18;
  undefined1 auVar19 [8];
  long lVar20;
  TestStatus *pTVar21;
  double dVar22;
  double dVar23;
  FuncSet funcs;
  IVal reference1;
  IVal in3;
  EvalContext ctx;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> outputs;
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> inputs;
  ostringstream oss;
  void *outputArr [2];
  void *inputArr [4];
  ResultCollector status;
  uint in_stack_fffffffffffffad8;
  undefined4 uStack_524;
  undefined8 local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_518;
  _Rb_tree_node_base *local_508;
  size_t local_500;
  IVal local_4f1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4f0;
  pointer local_4e8;
  string local_4e0;
  size_t local_4c0;
  IVal local_4b8;
  TestStatus *local_4a0;
  undefined1 local_498 [8];
  double dStack_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_488;
  double local_478;
  Precision local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_468;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  FloatFormat local_318;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2f0;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> local_2c0;
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> local_290;
  IVal local_230;
  undefined4 uStack_218;
  undefined4 uStack_214;
  ios_base local_1c0 [264];
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  ResultCollector local_80;
  
  this_01 = this->m_samplings;
  this_00 = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar16 = (this->m_caseCtx).numRandoms;
  local_4a0 = __return_storage_ptr__;
  iVar11 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>
            (&local_290,(shaderexecutor *)this_01,
             (Samplings<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>
              *)this_00,(FloatFormat *)(ulong)PVar3,(Precision)sVar16,(ulong)(iVar11 + 0xdeadbeef),
             in_stack_fffffffffffffad8);
  local_4e8 = local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  sVar16 = (long)local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2c0,sVar16);
  local_318.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2f0._M_impl.super__Rb_tree_header._M_header;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2f0._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_4f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_a8 = local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a0 = local_290.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_98 = local_290.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_90 = local_290.in3.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = local_2c0.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_b0 = local_2c0.out1.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_498 = (undefined1  [8])local_4f0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_490,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
  local_520 = (double)((ulong)local_520._4_4_ << 0x20);
  aStack_518._M_allocated_capacity = 0;
  local_500 = 0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_518._8_8_ = (_Rb_tree_node_base *)&local_520;
  local_508 = (_Rb_tree_node_base *)&local_520;
  local_4c0 = sVar16;
  (*pSVar4->_vptr_Statement[4])(pSVar4,&stack0xfffffffffffffad8);
  if ((_Rb_tree_node_base *)aStack_518._8_8_ != (_Rb_tree_node_base *)&local_520) {
    uVar13 = aStack_518._8_8_;
    do {
      (**(code **)(**(long **)(uVar13 + 0x20) + 0x30))(*(long **)(uVar13 + 0x20),&local_230);
      uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13);
    } while ((_Rb_tree_node_base *)uVar13 != (_Rb_tree_node_base *)&local_520);
  }
  sVar16 = local_4c0;
  if (local_500 != 0) {
    local_498 = (undefined1  [8])local_4f0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_490,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_490,
               (char *)CONCAT71(local_4e0._M_dataplus._M_p._1_7_,local_4e0._M_dataplus._M_p._0_1_),
               local_4e0._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_4e0._M_dataplus._M_p._1_7_,local_4e0._M_dataplus._M_p._0_1_) !=
        &local_4e0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_4e0._M_dataplus._M_p._1_7_,local_4e0._M_dataplus._M_p._0_1_),
                      local_4e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)&stack0xfffffffffffffad8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
  std::ios_base::~ios_base(local_1c0);
  pSVar5 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,sVar16 & 0xffffffff,&local_a8,&local_b8,0);
  local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffffffffff00);
  dStack_490 = INFINITY;
  aStack_488._M_allocated_capacity = 0xfff0000000000000;
  local_230._0_8_ = local_230._0_8_ & 0xffffffffffffff00;
  local_230.m_lo = INFINITY;
  local_230.m_hi = -INFINITY;
  in_stack_fffffffffffffad8 = in_stack_fffffffffffffad8 & 0xffffff00;
  local_520 = INFINITY;
  aStack_518._M_allocated_capacity = 0xfff0000000000000;
  local_4e0._M_dataplus._M_p._0_1_ = 0;
  local_4e0._M_string_length = 0x7ff0000000000000;
  local_4e0.field_2._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_2f0,
             (this->m_variables).in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_498);
  Environment::bind<float>
            ((Environment *)&local_2f0,
             (this->m_variables).in1.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,&local_230);
  Environment::bind<float>
            ((Environment *)&local_2f0,
             (this->m_variables).in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)&stack0xfffffffffffffad8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2f0,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4b8);
  Environment::bind<float>
            ((Environment *)&local_2f0,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)&local_4e0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2f0,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_4f1);
  if (local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish == local_4e8) {
LAB_008a9c0e:
    local_498 = (undefined1  [8])local_4f0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"All ",4);
    pTVar21 = local_4a0;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
    local_498 = (undefined1  [8])&aStack_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Pass","");
    pTVar21->m_code = QP_TEST_RESULT_PASS;
    (pTVar21->m_description)._M_dataplus._M_p = (pointer)&(pTVar21->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar21->m_description,local_498,
               (char *)((long)local_498 + (long)dStack_490));
    uVar13 = aStack_488._M_allocated_capacity;
    auVar19 = local_498;
    if (local_498 == (undefined1  [8])&aStack_488) goto LAB_008a9deb;
  }
  else {
    lVar17 = sVar16 + (sVar16 == 0);
    lVar20 = 0;
    local_4e8 = (pointer)0x0;
    do {
      local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffffffffff00;
      local_4b8.m_lo = INFINITY;
      local_4b8.m_hi = -INFINITY;
      dVar23 = (double)*(float *)((long)local_290.in0.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar20);
      oVar8 = (ostringstream)
              NAN(*(float *)((long)local_290.in0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar20));
      dStack_490 = INFINITY;
      if (!(bool)oVar8) {
        dStack_490 = dVar23;
      }
      aStack_488._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)oVar8) {
        aStack_488._M_allocated_capacity = (size_type)dVar23;
      }
      local_498[0] = oVar8;
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffad8,this_00,(Interval *)local_498,false);
      tcu::FloatFormat::convert(&local_230,this_00,(Interval *)&stack0xfffffffffffffad8);
      pIVar14 = Environment::lookup<float>
                          ((Environment *)&local_2f0,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar14->m_hi = local_230.m_hi;
      pIVar14->m_hasNaN = local_230.m_hasNaN;
      *(undefined7 *)&pIVar14->field_0x1 = local_230._1_7_;
      pIVar14->m_lo = local_230.m_lo;
      dVar23 = (double)*(float *)((long)local_290.in1.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar20);
      local_498[0] = (ostringstream)
                     NAN(*(float *)((long)local_290.in1.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar20));
      dStack_490 = INFINITY;
      if (!(bool)local_498[0]) {
        dStack_490 = dVar23;
      }
      aStack_488._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)local_498[0]) {
        aStack_488._M_allocated_capacity = (size_type)dVar23;
      }
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffad8,this_00,(Interval *)local_498,false);
      tcu::FloatFormat::convert(&local_230,this_00,(Interval *)&stack0xfffffffffffffad8);
      pIVar14 = Environment::lookup<float>
                          ((Environment *)&local_2f0,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar14->m_hi = local_230.m_hi;
      pIVar14->m_hasNaN = local_230.m_hasNaN;
      *(undefined7 *)&pIVar14->field_0x1 = local_230._1_7_;
      pIVar14->m_lo = local_230.m_lo;
      dVar23 = (double)*(float *)((long)local_290.in2.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar20);
      local_498[0] = (ostringstream)
                     NAN(*(float *)((long)local_290.in2.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar20));
      dStack_490 = INFINITY;
      if (!(bool)local_498[0]) {
        dStack_490 = dVar23;
      }
      aStack_488._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)local_498[0]) {
        aStack_488._M_allocated_capacity = (size_type)dVar23;
      }
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffad8,this_00,(Interval *)local_498,false);
      tcu::FloatFormat::convert(&local_230,this_00,(Interval *)&stack0xfffffffffffffad8);
      pIVar14 = Environment::lookup<float>
                          ((Environment *)&local_2f0,
                           (this->m_variables).in2.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar14->m_hi = local_230.m_hi;
      pIVar14->m_hasNaN = local_230.m_hasNaN;
      *(undefined7 *)&pIVar14->field_0x1 = local_230._1_7_;
      pIVar14->m_lo = local_230.m_lo;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2f0,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_470 = (this->m_caseCtx).precision;
      local_478 = (this->m_caseCtx).floatFormat.m_maxValue;
      local_498 = *(undefined1 (*) [8])this_00;
      dStack_490 = *(double *)&(this->m_caseCtx).floatFormat.m_fractionBits;
      aStack_488._M_allocated_capacity = *(undefined8 *)&(this->m_caseCtx).floatFormat.m_hasInf;
      aStack_488._8_1_ = (this->m_caseCtx).floatFormat.m_exactPrecision;
      aStack_488._9_7_ = *(undefined7 *)&(this->m_caseCtx).floatFormat.field_0x19;
      local_460 = 0;
      pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_468 = &local_2f0;
      (*pSVar4->_vptr_Statement[3])(pSVar4,(Interval *)local_498);
      pIVar14 = Environment::lookup<float>
                          ((Environment *)&local_2f0,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_498,&local_318,pIVar14);
      local_4b8.m_hi = (double)aStack_488._M_allocated_capacity;
      local_4b8._0_8_ = local_498;
      uVar13 = local_4b8._0_8_;
      local_4b8.m_lo = dStack_490;
      fVar2 = *(float *)((long)local_2c0.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar20);
      dVar22 = (double)fVar2;
      dVar23 = dVar22;
      if (NAN(fVar2)) {
        dVar23 = INFINITY;
        dVar22 = -INFINITY;
      }
      IVar18 = (IVal)(dVar22 <= (double)aStack_488._M_allocated_capacity && dStack_490 <= dVar23);
      if ((NAN(fVar2)) &&
         (dVar22 <= (double)aStack_488._M_allocated_capacity && dStack_490 <= dVar23)) {
        local_4b8.m_hasNaN = local_498[0];
        IVar18 = (IVal)local_4b8.m_hasNaN;
      }
      local_498 = (undefined1  [8])&aStack_488;
      local_4b8._0_8_ = uVar13;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar18 & 1),(string *)local_498);
      if (local_498 != (undefined1  [8])&aStack_488) {
        operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
      }
      if (!bVar10) {
        uVar12 = (int)local_4e8 + 1;
        local_4e8 = (pointer)(ulong)uVar12;
        ppdVar9 = (double **)&local_230.m_hi;
        if ((int)uVar12 < 0x65) {
          local_498 = (undefined1  [8])local_4f0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
          pVVar6 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_230._0_8_ = ppdVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)local_230._0_8_,(long)local_230.m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
          valueToString<float>
                    ((string *)&stack0xfffffffffffffad8,&local_318,
                     (float *)((long)local_290.in0.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)CONCAT44(uStack_524,in_stack_fffffffffffffad8),
                     (long)local_520);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_524,in_stack_fffffffffffffad8) != &aStack_518) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_524,in_stack_fffffffffffffad8),
                            (ulong)(aStack_518._M_allocated_capacity + 1));
          }
          if ((double **)local_230._0_8_ != ppdVar9) {
            operator_delete((void *)local_230._0_8_,(long)local_230.m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
          pVVar6 = (this->m_variables).in1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_230._0_8_ = ppdVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)local_230._0_8_,(long)local_230.m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
          valueToString<float>
                    ((string *)&stack0xfffffffffffffad8,&local_318,
                     (float *)((long)local_290.in1.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)CONCAT44(uStack_524,in_stack_fffffffffffffad8),
                     (long)local_520);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_524,in_stack_fffffffffffffad8) != &aStack_518) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_524,in_stack_fffffffffffffad8),
                            (ulong)(aStack_518._M_allocated_capacity + 1));
          }
          if ((double **)local_230._0_8_ != ppdVar9) {
            operator_delete((void *)local_230._0_8_,(long)local_230.m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
          pVVar6 = (this->m_variables).in2.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_230._0_8_ = ppdVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)local_230._0_8_,(long)local_230.m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
          valueToString<float>
                    ((string *)&stack0xfffffffffffffad8,&local_318,
                     (float *)((long)local_290.in2.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)CONCAT44(uStack_524,in_stack_fffffffffffffad8),
                     (long)local_520);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_524,in_stack_fffffffffffffad8) != &aStack_518) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_524,in_stack_fffffffffffffad8),
                            (ulong)(aStack_518._M_allocated_capacity + 1));
          }
          if ((double **)local_230._0_8_ != ppdVar9) {
            operator_delete((void *)local_230._0_8_,(long)local_230.m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
          pVVar6 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_230._0_8_ = ppdVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)local_230._0_8_,(long)local_230.m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
          valueToString<float>
                    ((string *)&stack0xfffffffffffffad8,&local_318,
                     (float *)((long)local_2c0.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,(char *)CONCAT44(uStack_524,in_stack_fffffffffffffad8),
                     (long)local_520);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,"\tExpected range: ",0x11);
          intervalToString<float>(&local_4e0,&local_318,&local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_490,
                     (char *)CONCAT71(local_4e0._M_dataplus._M_p._1_7_,
                                      local_4e0._M_dataplus._M_p._0_1_),local_4e0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4e0._M_dataplus._M_p._1_7_,local_4e0._M_dataplus._M_p._0_1_) !=
              &local_4e0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_4e0._M_dataplus._M_p._1_7_,
                                     local_4e0._M_dataplus._M_p._0_1_),
                            local_4e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_524,in_stack_fffffffffffffad8) != &aStack_518) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_524,in_stack_fffffffffffffad8),
                            (ulong)(aStack_518._M_allocated_capacity + 1));
          }
          if ((double **)local_230._0_8_ != ppdVar9) {
            operator_delete((void *)local_230._0_8_,(long)local_230.m_hi + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
          std::ios_base::~ios_base(local_420);
        }
      }
      lVar20 = lVar20 + 4;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    iVar11 = (int)local_4e8;
    if (iVar11 < 0x65) {
      if (iVar11 == 0) goto LAB_008a9c0e;
    }
    else {
      local_498 = (undefined1  [8])local_4f0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_490,iVar11 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
      std::ios_base::~ios_base(local_420);
    }
    local_498 = (undefined1  [8])local_4f0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::ostream::operator<<((ostringstream *)&dStack_490,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::ostream::operator<<(local_498,iVar11);
    pTVar21 = local_4a0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    local_498 = (undefined1  [8])&aStack_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498," test failed. Check log for the details","");
    uVar13 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_524,in_stack_fffffffffffffad8) != &aStack_518) {
      uVar13 = aStack_518._M_allocated_capacity;
    }
    if ((ulong)uVar13 < (_Base_ptr)((long)dStack_490 + (long)local_520)) {
      uVar13 = (_Base_ptr)0xf;
      if (local_498 != (undefined1  [8])&aStack_488) {
        uVar13 = aStack_488._M_allocated_capacity;
      }
      if ((ulong)uVar13 < (_Base_ptr)((long)dStack_490 + (long)local_520)) goto LAB_008a9c01;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_498,0,(char *)0x0,
                           CONCAT44(uStack_524,in_stack_fffffffffffffad8));
    }
    else {
LAB_008a9c01:
      puVar15 = (undefined8 *)
                std::__cxx11::string::_M_append(&stack0xfffffffffffffad8,(ulong)local_498);
    }
    pdVar1 = (double *)(puVar15 + 2);
    if ((double *)*puVar15 == pdVar1) {
      local_230.m_hi = *pdVar1;
      uStack_218 = *(undefined4 *)(puVar15 + 3);
      uStack_214 = *(undefined4 *)((long)puVar15 + 0x1c);
      local_230._0_8_ = &local_230.m_hi;
    }
    else {
      local_230.m_hi = *pdVar1;
      local_230._0_8_ = (double *)*puVar15;
    }
    local_230.m_lo = (double)puVar15[1];
    *puVar15 = pdVar1;
    puVar15[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar21->m_code = QP_TEST_RESULT_FAIL;
    (pTVar21->m_description)._M_dataplus._M_p = (pointer)&(pTVar21->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar21->m_description,local_230._0_8_,
               (undefined1 *)((long)local_230.m_lo + local_230._0_8_));
    if ((double *)local_230._0_8_ != &local_230.m_hi) {
      operator_delete((void *)local_230._0_8_,(long)local_230.m_hi + 1);
    }
    if (local_498 != (undefined1  [8])&aStack_488) {
      operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
    }
    auVar19 = (undefined1  [8])CONCAT44(uStack_524,in_stack_fffffffffffffad8);
    uVar13 = aStack_518._M_allocated_capacity;
    if (auVar19 == (undefined1  [8])&aStack_518) goto LAB_008a9deb;
  }
  operator_delete((void *)auVar19,(ulong)((long)&((_Base_ptr)uVar13)->_M_color + 1));
LAB_008a9deb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2f0);
  if (local_2c0.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c0.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c0.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c0.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_290.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_290.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_290.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_290.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_290.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_290.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pTVar21;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}